

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmBitFieldDn<(moira::Instr)135,(moira::Mode)2,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  u32 uVar2;
  StrWriter *this_00;
  Dn dn;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint value;
  Ea<(moira::Mode)2,_4> result;
  
  uVar1 = *addr;
  uVar2 = dasmIncRead<2>(this,addr);
  if (((uVar2 & 0xf000) != 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)135,(moira::Mode)2,4>(this,str,addr,op);
    return;
  }
  uVar5 = uVar2 >> 6;
  value = uVar5 & 0x1f;
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  result.pc = *addr;
  result.reg = op & 7;
  StrWriter::operator<<(str,&result);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    uVar4 = uVar2 & 0x820;
    StrWriter::operator<<(str,",");
    if (uVar4 == 0x820) {
      StrWriter::operator<<(str,(Dn)(uVar5 & 7));
    }
    else {
      if (uVar4 != 0x20) {
        if (uVar4 == 0x800) {
          StrWriter::operator<<(str,(Dn)(uVar5 & 7));
        }
        else {
          StrWriter::operator<<(str,value);
        }
        StrWriter::operator<<(str,",");
        StrWriter::operator<<(str,uVar2 & 0x1f);
        goto LAB_002d642f;
      }
      StrWriter::operator<<(str,value);
    }
    StrWriter::operator<<(str,",");
    StrWriter::operator<<(str,(Dn)(uVar2 & 7));
    goto LAB_002d642f;
  }
  bVar3 = 0x20;
  if ((uVar2 & 0x1f) != 0) {
    bVar3 = (byte)uVar2 & 0x1f;
  }
  uVar4 = uVar2 & 0x820;
  StrWriter::operator<<(str," {");
  if (uVar4 == 0x820) {
    StrWriter::operator<<(str,(Dn)(uVar5 & 7));
LAB_002d63b0:
    StrWriter::operator<<(str,":");
    dn.raw._1_3_ = 0;
    dn.raw._0_1_ = bVar3 & 7;
    StrWriter::operator<<(str,dn);
  }
  else {
    if (uVar4 == 0x20) {
      StrWriter::operator<<(str,value);
      goto LAB_002d63b0;
    }
    if (uVar4 == 0x800) {
      StrWriter::operator<<(str,(Dn)(uVar5 & 7));
    }
    else {
      StrWriter::operator<<(str,value);
    }
    StrWriter::operator<<(str,":");
    StrWriter::operator<<(str,(uint)bVar3);
  }
  StrWriter::operator<<(str,"}");
LAB_002d642f:
  result.pc = 0;
  StrWriter::operator<<(str,(Av<(moira::Instr)135,_(moira::Mode)2,_4> *)&result);
  return;
}

Assistant:

void
Moira::dasmBitFieldDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word>(addr);
    auto dst = _____________xxx(op);
    auto o   = _____xxxxx______(ext);
    auto w   = ___________xxxxx(ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;

    if constexpr (I == Instr::BFINS) {
        str << Dn ( _xxx____________(ext) ) << Sep{};
    }

    str << Op<M, S>(dst, addr);

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (ext & 0x0820) {

                case 0x0000: str << "," << o << "," << w; break;
                case 0x0020: str << "," << o << "," << Dn{w&7}; break;
                case 0x0800: str << "," << Dn{o&7} << "," << w; break;
                case 0x0820: str << "," << Dn{o&7} << "," << Dn{w&7}; break;
            }
            break;

        default:

            if (w == 0) w = 32;

            switch (ext & 0x0820) {

                case 0x0000: str << " {" << o << ":" << w << "}"; break;
                case 0x0020: str << " {" << o << ":" << Dn{w&7} << "}"; break;
                case 0x0800: str << " {" << Dn{o&7} << ":" << w << "}"; break;
                case 0x0820: str << " {" << Dn{o&7} << ":" << Dn{w&7} << "}"; break;
            }
    }

    if constexpr (I == Instr::BFEXTU || I == Instr::BFEXTS || I == Instr::BFFFO) {
        str << Sep{} << Dn ( _xxx____________(ext) );
    }
    str << Av<I, M, S>{};
}